

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_client.c
# Opt level: O3

int mqtt_client_subscribe
              (MQTT_CLIENT_HANDLE handle,uint16_t packetId,SUBSCRIBE_PAYLOAD *subscribeList,
              size_t count)

{
  int iVar1;
  STRING_HANDLE trace_log;
  BUFFER_HANDLE handle_00;
  size_t length;
  uchar *data;
  LOGGER_LOG p_Var2;
  undefined6 in_register_00000032;
  ulong uVar3;
  
  uVar3 = CONCAT62(in_register_00000032,packetId) & 0xffffffff;
  if (((((int)CONCAT62(in_register_00000032,packetId) == 0) || (handle == (MQTT_CLIENT_HANDLE)0x0))
      || (subscribeList == (SUBSCRIBE_PAYLOAD *)0x0)) || (count == 0)) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x4ba;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                ,"mqtt_client_subscribe",0x4b9,1,
                "Invalid parameter specified mqtt_client: %p, subscribeList: %p, count: %lu, packetId: %d"
                ,handle,subscribeList,count,uVar3);
    }
  }
  else {
    if ((handle->mqtt_flags & 1) == 0) {
      trace_log = (STRING_HANDLE)0x0;
    }
    else {
      trace_log = STRING_new();
    }
    handle_00 = mqtt_codec_subscribe((uint16_t)uVar3,subscribeList,count,trace_log);
    if (handle_00 == (BUFFER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x4c5;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                  ,"mqtt_client_subscribe",0x4c4,1,"Error: mqtt_codec_subscribe failed");
      }
    }
    else {
      handle->packetState = SUBSCRIBE_TYPE;
      length = BUFFER_length(handle_00);
      data = BUFFER_u_char(handle_00);
      iVar1 = sendPacketItem(handle,data,length);
      if (iVar1 == 0) {
        log_outgoing_trace((MQTT_CLIENT *)(ulong)handle->mqtt_flags,trace_log);
        iVar1 = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0x4d1;
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_client.c"
                    ,"mqtt_client_subscribe",0x4d0,1,"Error: mqtt_client_subscribe send failed");
        }
      }
      BUFFER_delete(handle_00);
    }
    if (trace_log != (STRING_HANDLE)0x0) {
      STRING_delete(trace_log);
    }
  }
  return iVar1;
}

Assistant:

int mqtt_client_subscribe(MQTT_CLIENT_HANDLE handle, uint16_t packetId, SUBSCRIBE_PAYLOAD* subscribeList, size_t count)
{
    int result;
    MQTT_CLIENT* mqtt_client = (MQTT_CLIENT*)handle;
    if (mqtt_client == NULL || subscribeList == NULL || count == 0 || packetId == 0)
    {
        /*Codes_SRS_MQTT_CLIENT_07_013: [If any of the parameters handle, subscribeList is NULL or count is 0 then mqtt_client_subscribe shall return a non-zero value.]*/
        LogError("Invalid parameter specified mqtt_client: %p, subscribeList: %p, count: %lu, packetId: %d", mqtt_client, subscribeList, (unsigned long)count, packetId);
        result = MU_FAILURE;
    }
    else
    {
        STRING_HANDLE trace_log = construct_trace_log_handle(mqtt_client);

        BUFFER_HANDLE subPacket = mqtt_codec_subscribe(packetId, subscribeList, count, trace_log);
        if (subPacket == NULL)
        {
            /*Codes_SRS_MQTT_CLIENT_07_014: [If any failure is encountered then mqtt_client_subscribe shall return a non-zero value.]*/
            LogError("Error: mqtt_codec_subscribe failed");
            result = MU_FAILURE;
        }
        else
        {
            mqtt_client->packetState = SUBSCRIBE_TYPE;

            size_t size = BUFFER_length(subPacket);
            /*Codes_SRS_MQTT_CLIENT_07_015: [On success mqtt_client_subscribe shall send the MQTT SUBCRIBE packet to the endpoint.]*/
            if (sendPacketItem(mqtt_client, BUFFER_u_char(subPacket), size) != 0)
            {
                /*Codes_SRS_MQTT_CLIENT_07_014: [If any failure is encountered then mqtt_client_subscribe shall return a non-zero value.]*/
                LogError("Error: mqtt_client_subscribe send failed");
                result = MU_FAILURE;
            }
            else
            {
                log_outgoing_trace(mqtt_client, trace_log);
                result = 0;
            }
            BUFFER_delete(subPacket);
        }
        if (trace_log != NULL)
        {
            STRING_delete(trace_log);
        }
    }
    return result;
}